

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_parser.cpp
# Opt level: O2

shared_ptr<Node> ParseCondition(istream *is)

{
  logic_error *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  istream *in_RSI;
  shared_ptr<Node> sVar1;
  iterator current;
  __shared_ptr<EmptyNode,_(__gnu_cxx::_Lock_policy)2> local_40;
  vector<Token,_std::allocator<Token>_> tokens;
  
  Tokenize(&tokens,in_RSI);
  current._M_current =
       tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
       _M_start;
  ParseExpression<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
            ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)is,
             (Token *)&current,
             (uint)tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                   super__Vector_impl_data._M_finish);
  if (*(long *)is == 0) {
    std::make_shared<EmptyNode>();
    std::__shared_ptr<Node,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Node,(__gnu_cxx::_Lock_policy)2> *)is,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  if (current._M_current ==
      tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::vector<Token,_std::allocator<Token>_>::~vector(&tokens);
    sVar1.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar1.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)is;
    return (shared_ptr<Node>)sVar1.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Unexpected tokens after condition");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

shared_ptr<Node> ParseCondition(istream& is) {
    auto tokens = Tokenize(is);
    auto current = tokens.begin();
    auto top_node = ParseExpression(current, tokens.end(), 0u);

    if (!top_node) {
        top_node = make_shared<EmptyNode>();
    }

    if (current != tokens.end()) {
        throw logic_error("Unexpected tokens after condition");
    }

    return top_node;
}